

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_write_qcc(opj_j2k_t *j2k,int compno)

{
  opj_cio_t *cio;
  int pos;
  int pos_00;
  
  cio = j2k->cio;
  cio_write(cio,0xff5d,2);
  pos = cio_tell(cio);
  cio_skip(cio,2);
  cio_write(cio,(long)compno,2 - (uint)(j2k->image->numcomps < 0x101));
  j2k_write_qcx(j2k,compno);
  pos_00 = cio_tell(cio);
  cio_seek(cio,pos);
  cio_write(cio,(long)(pos_00 - pos),2);
  cio_seek(cio,pos_00);
  return;
}

Assistant:

static void j2k_write_qcc(opj_j2k_t *j2k, int compno) {
	int lenp, len;

	opj_cio_t *cio = j2k->cio;
	
	cio_write(cio, J2K_MS_QCC, 2);	/* QCC */
	lenp = cio_tell(cio);
	cio_skip(cio, 2);
	cio_write(cio, compno, j2k->image->numcomps <= 256 ? 1 : 2);	/* Cqcc */
	j2k_write_qcx(j2k, compno);
	len = cio_tell(cio) - lenp;
	cio_seek(cio, lenp);
	cio_write(cio, len, 2);			/* Lqcc */
	cio_seek(cio, lenp + len);
}